

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title-threadsafe.c
# Opt level: O1

void setter_thread_body(void *arg)

{
  uv_loop_t **buffer;
  int iVar1;
  uv_loop_t *puVar2;
  uv_loop_t *loop;
  int extraout_EDX;
  int iVar3;
  void **ppvVar4;
  long *title;
  uv_handle_t *puVar5;
  int64_t eval_b;
  int64_t eval_a;
  uv_handle_t auStack_ca8 [4];
  uv_loop_t *puStack_ba0;
  undefined8 uStack_b90;
  code *pcStack_b88;
  void *pvStack_b80;
  undefined1 auStack_b78 [16];
  uv_process_t uStack_b68;
  uv_loop_t *puStack_b00;
  char *pcStack_af8;
  long *plStack_af0;
  long *plStack_ae8;
  undefined8 uStack_ae0;
  uv_process_options_t uStack_ad0;
  long alStack_a80 [63];
  undefined1 uStack_881;
  uv_loop_t uStack_880;
  char *pcStack_480;
  char *pcStack_478;
  code *pcStack_470;
  undefined8 uStack_468;
  long lStack_460;
  char acStack_458 [512];
  code *pcStack_258;
  long alStack_250 [66];
  undefined8 uStack_40;
  undefined8 local_38;
  long local_30;
  
  iVar3 = 0x32;
  while( true ) {
    uStack_40 = 0x1b3766;
    iVar1 = uv_set_process_title
                      ("8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled")
    ;
    local_30 = (long)iVar1;
    local_38 = 0;
    if (local_30 != 0) break;
    uStack_40 = 0x1b378c;
    iVar1 = uv_set_process_title
                      ("jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82")
    ;
    local_30 = (long)iVar1;
    local_38 = 0;
    if (local_30 != 0) {
LAB_001b3819:
      uStack_40 = 0x1b3826;
      setter_thread_body_cold_2();
      break;
    }
    uStack_40 = 0x1b37ae;
    iVar1 = uv_set_process_title
                      ("9niCI5icXGFS72XudhXqo5alftmZ1tpE7B3cwUmrq0CCDjC84FzBNB8XAHqvpNQfI2QAQG6ztT")
    ;
    local_30 = (long)iVar1;
    local_38 = 0;
    if (local_30 != 0) {
LAB_001b380c:
      uStack_40 = 0x1b3819;
      setter_thread_body_cold_3();
      goto LAB_001b3819;
    }
    uStack_40 = 0x1b37d0;
    iVar1 = uv_set_process_title
                      ("n8qXVXuG6IEHDpabJgTEiwtpY6LHMZ8MgznnMpdHARu5EywufA6hcBaQfetb0YhEsK0ykDd7JU")
    ;
    local_30 = (long)iVar1;
    local_38 = 0;
    if (local_30 != 0) {
      uStack_40 = 0x1b380c;
      setter_thread_body_cold_4();
      goto LAB_001b380c;
    }
    iVar3 = iVar3 + -1;
    local_30 = 0;
    if (iVar3 == 0) {
      return;
    }
  }
  uStack_40 = 0x1b3833;
  setter_thread_body_cold_1();
  title = alStack_250;
  pcStack_258 = (code *)0x1b3847;
  set_title("%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s");
  pcStack_258 = (code *)0x1b3853;
  set_title("new title");
  pcStack_258 = (code *)0x1b385f;
  iVar3 = uv_get_process_title((char *)0x0,100);
  alStack_250[2] = (long)iVar3;
  alStack_250[0] = -0x16;
  if (alStack_250[2] == -0x16) {
    pcStack_258 = (code *)0x1b3885;
    iVar3 = uv_get_process_title((char *)(alStack_250 + 2),0);
    alStack_250[0] = (long)iVar3;
    alStack_250[1] = 0xffffffffffffffea;
    if (alStack_250[0] != -0x16) goto LAB_001b38df;
    pcStack_258 = (code *)0x1b38ae;
    iVar3 = uv_get_process_title((char *)(alStack_250 + 2),1);
    alStack_250[0] = (long)iVar3;
    alStack_250[1] = 0xffffffffffffff97;
    if (alStack_250[0] == -0x69) {
      return;
    }
  }
  else {
    pcStack_258 = (code *)0x1b38df;
    run_test_process_title_cold_1();
LAB_001b38df:
    pcStack_258 = (code *)0x1b38ec;
    run_test_process_title_cold_2();
  }
  pcStack_258 = set_title;
  run_test_process_title_cold_3();
  pcStack_258 = (code *)0x2044ca;
  pcStack_470 = (code *)0x1b3913;
  iVar3 = uv_get_process_title(acStack_458,0x200);
  lStack_460 = (long)iVar3;
  uStack_468 = 0;
  if (lStack_460 == 0) {
    pcStack_470 = (code *)0x1b3935;
    iVar3 = uv_set_process_title((char *)title);
    lStack_460 = (long)iVar3;
    uStack_468 = 0;
    if (lStack_460 != 0) goto LAB_001b39b5;
    pcStack_470 = (code *)0x1b395e;
    iVar3 = uv_get_process_title(acStack_458,0x200);
    lStack_460 = (long)iVar3;
    uStack_468 = 0;
    if (lStack_460 != 0) goto LAB_001b39c2;
    pcStack_470 = (code *)0x1b3985;
    iVar3 = strcmp(acStack_458,(char *)title);
    lStack_460 = (long)iVar3;
    uStack_468 = 0;
    if (lStack_460 == 0) {
      return;
    }
  }
  else {
    pcStack_470 = (code *)0x1b39b5;
    set_title_cold_1();
LAB_001b39b5:
    pcStack_470 = (code *)0x1b39c2;
    set_title_cold_2();
LAB_001b39c2:
    pcStack_470 = (code *)0x1b39cf;
    set_title_cold_3();
  }
  pcStack_470 = run_test_process_title_big_argv;
  set_title_cold_4();
  pcStack_470 = (code *)0x204560;
  pcStack_478 = "jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82";
  ppvVar4 = &pvStack_b80;
  auStack_b78._8_8_ = (uv_loop_t *)0x3ff;
  loop = &uStack_880;
  pcStack_b88 = (code *)0x1b3a04;
  pcStack_480 = (char *)title;
  iVar3 = uv_exepath((char *)loop,(size_t *)(auStack_b78 + 8));
  alStack_a80[0] = (long)iVar3;
  uStack_b68.data = (void *)0x0;
  if (alStack_a80[0] == 0) {
    *(undefined1 *)((long)(auStack_b78._8_8_ + 0x38) + (long)(uStack_880.reserved + -0xe)) = 0;
    pcStack_b88 = (code *)0x1b3a54;
    memset(alStack_a80,0x78,0x1ff);
    uStack_881 = 0;
    uStack_ad0.args = (char **)&puStack_b00;
    pcStack_af8 = "process_title_big_argv_helper";
    uStack_ae0 = 0;
    uStack_ad0.env = (char **)0x0;
    uStack_ad0.cwd = (char *)0x0;
    uStack_ad0.flags = 0;
    uStack_ad0.stdio_count = 0;
    uStack_ad0.stdio = (uv_stdio_container_t *)0x0;
    uStack_ad0.uid = 0;
    uStack_ad0.gid = 0;
    uStack_ad0.cpumask = (char *)0x0;
    uStack_ad0.cpumask_size = 0;
    uStack_ad0.exit_cb = exit_cb;
    pcStack_b88 = (code *)0x1b3ab7;
    puStack_b00 = loop;
    plStack_af0 = alStack_a80;
    plStack_ae8 = alStack_a80;
    uStack_ad0.file = (char *)loop;
    puVar2 = uv_default_loop();
    pcStack_b88 = (code *)0x1b3ac7;
    iVar3 = uv_spawn(puVar2,&uStack_b68,&uStack_ad0);
    auStack_b78._0_8_ = SEXT48(iVar3);
    pvStack_b80 = (void *)0x0;
    if ((void *)auStack_b78._0_8_ != (void *)0x0) goto LAB_001b3b7a;
    pcStack_b88 = (code *)0x1b3ae6;
    puVar2 = uv_default_loop();
    pcStack_b88 = (code *)0x1b3af0;
    iVar3 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_b78._0_8_ = SEXT48(iVar3);
    pvStack_b80 = (void *)0x0;
    if ((void *)auStack_b78._0_8_ == (void *)0x0) {
      pcStack_b88 = (code *)0x1b3b0f;
      loop = uv_default_loop();
      pcStack_b88 = (code *)0x1b3b23;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      pcStack_b88 = (code *)0x1b3b2d;
      uv_run(loop,UV_RUN_DEFAULT);
      auStack_b78._0_8_ = (void *)0x0;
      pcStack_b88 = (code *)0x1b3b3b;
      puVar2 = uv_default_loop();
      pcStack_b88 = (code *)0x1b3b43;
      iVar3 = uv_loop_close(puVar2);
      pvStack_b80 = (void *)(long)iVar3;
      if ((void *)auStack_b78._0_8_ == pvStack_b80) {
        pcStack_b88 = (code *)0x1b3b59;
        uv_library_shutdown();
        return;
      }
      goto LAB_001b3b94;
    }
  }
  else {
    pcStack_b88 = (code *)0x1b3b7a;
    run_test_process_title_big_argv_cold_1();
LAB_001b3b7a:
    pcStack_b88 = (code *)0x1b3b87;
    run_test_process_title_big_argv_cold_2();
  }
  pcStack_b88 = (code *)0x1b3b94;
  run_test_process_title_big_argv_cold_3();
LAB_001b3b94:
  puVar5 = (uv_handle_t *)auStack_b78;
  pcStack_b88 = exit_cb;
  run_test_process_title_big_argv_cold_4();
  uStack_b90 = 0;
  if (ppvVar4 == (void **)0x0) {
    pcStack_b88 = (code *)(long)extraout_EDX;
    uStack_b90 = 0;
    if (pcStack_b88 == (code *)0x0) {
      uv_close(puVar5,(uv_close_cb)0x0);
      return;
    }
  }
  else {
    puStack_ba0 = (uv_loop_t *)0x1b3bf6;
    pcStack_b88 = (code *)ppvVar4;
    exit_cb_cold_1();
  }
  puStack_ba0 = (uv_loop_t *)process_title_big_argv;
  exit_cb_cold_2();
  buffer = &auStack_ca8[0].loop;
  puStack_ba0 = loop;
  memset(buffer,0,0x100);
  auStack_ca8[0].loop._0_4_ = 0x6c696166;
  uv_get_process_title((char *)buffer,0x100);
  auStack_ca8[0].data = (void *)0x0;
  iVar3 = strcmp((char *)buffer,"fail");
  if (auStack_ca8[0].data != (void *)(long)iVar3) {
    return;
  }
  puVar5 = auStack_ca8;
  process_title_big_argv_cold_1();
  iVar3 = uv_is_closing(puVar5);
  if (iVar3 != 0) {
    return;
  }
  uv_close(puVar5,(uv_close_cb)0x0);
  return;
}

Assistant:

static void setter_thread_body(void* arg) {
  int i;

  for (i = 0; i < NUM_ITERATIONS; i++) {
    ASSERT_OK(uv_set_process_title(titles[0]));
    ASSERT_OK(uv_set_process_title(titles[1]));
    ASSERT_OK(uv_set_process_title(titles[2]));
    ASSERT_OK(uv_set_process_title(titles[3]));
  }
}